

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRendering_Test::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRendering_Test
          (SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRendering_Test
           *this)

{
  SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRendering_Test
  *this_local;
  
  SDLGraphicsSystemWithLoadedTexture::SDLGraphicsSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  (this->super_SDLGraphicsSystemWithLoadedTexture).super_SDLGraphicsSystemWithCreatedWindowTests.
  super_SDLGraphicsSystemTests.super_Test._vptr_Test =
       (_func_int **)
       &
       PTR__SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRendering_Test_00506470
  ;
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfSDLRenderCopyFailedDuringTextureRendering)
{
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   IsOptionalEq(srcRect), IsOptionalEq(dstRect))
    ).WillOnce(Return(failure));

    EXPECT_THROW(
        system.renderTexture(textureId0, texturePosition, textureArea),
        std::runtime_error
    );

    expectQuitSystemWithLoadedTexture();
}